

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_leaf(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  lysp_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lysp_node *plVar5;
  lysp_node *plVar6;
  char *pcVar7;
  uint32_t substmt_index;
  ly_ctx *plVar8;
  yang_arg arg;
  char *in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  bool bVar9;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  LVar4 = LVar3;
  if (LVar3 == LY_SUCCESS) {
    plVar5 = (lysp_node *)calloc(1,0xd8);
    if (plVar5 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      in_R8 = "lysp_stmt_leaf";
      LVar3 = LY_EMEM;
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
    }
    else {
      plVar1 = *siblings;
      if (*siblings == (lysp_node *)0x0) {
        *siblings = plVar5;
      }
      else {
        do {
          plVar6 = plVar1;
          plVar1 = plVar6->next;
        } while (plVar1 != (lysp_node *)0x0);
        plVar6->next = plVar5;
      }
    }
    LVar4 = LVar3;
    if (plVar5 != (lysp_node *)0x0) {
      plVar5->nodetype = 4;
      plVar5->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar4 = lydict_insert(plVar8,stmt->arg,0,&plVar5->name);
      if (LVar4 == LY_SUCCESS) {
        stmt_01 = stmt->child;
        bVar9 = stmt_01 == (lysp_stmt *)0x0;
        LVar4 = LVar3;
        if (!bVar9) {
          exts = &plVar5->exts;
          iVar2 = (int)plVar5;
          flags = &plVar5->flags;
          do {
            stmt_00 = stmt_01->kw;
            arg = (yang_arg)exts;
            if ((int)stmt_00 < 0x1d0000) {
              if (0xeffff < (int)stmt_00) {
                if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
                  in_R8 = (char *)exts;
                  LVar4 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_LEAF,0,exts);
                }
                else if (stmt_00 == LY_STMT_IF_FEATURE) {
                  LVar4 = lysp_stmt_qnames(ctx,stmt_01,&plVar5->iffeatures,arg,
                                           (lysp_ext_instance **)in_R8);
                }
                else {
                  if (stmt_00 != LY_STMT_MANDATORY) goto LAB_0016cc7d;
                  LVar4 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
                }
                goto LAB_0016cc01;
              }
              if (stmt_00 == LY_STMT_CONFIG) {
                LVar4 = lysp_stmt_config(ctx,stmt_01,flags,exts);
                goto LAB_0016cc01;
              }
              if (stmt_00 != LY_STMT_DEFAULT) {
                substmt_index = iVar2 + 0x20;
                if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_0016cba5;
LAB_0016cc7d:
                if (ctx == (lysp_ctx *)0x0) {
                  plVar8 = (ly_ctx *)0x0;
                }
                else {
                  plVar8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar7 = lyplg_ext_stmt2str(stmt_00);
                ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7,"leaf");
                LVar4 = LY_EVALID;
                break;
              }
              in_R8 = (char *)exts;
              LVar4 = lysp_stmt_text_field(ctx,stmt_01,iVar2 + 0xc0,(char **)0x2,arg,in_R9);
              if (LVar4 != LY_SUCCESS) break;
              *(lyd_node **)&plVar5[3].nodetype =
                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            else {
              if ((int)stmt_00 < 0x2e0000) {
                if (stmt_00 == LY_STMT_MUST) {
                  LVar4 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(plVar5 + 1));
                }
                else {
                  substmt_index = iVar2 + 0x28;
                  if (stmt_00 == LY_STMT_REFERENCE) {
LAB_0016cba5:
                    in_R8 = (char *)exts;
                    LVar4 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,arg,in_R9);
                  }
                  else {
                    if (stmt_00 != LY_STMT_STATUS) goto LAB_0016cc7d;
                    LVar4 = lysp_stmt_status(ctx,stmt_01,flags,exts);
                  }
                }
              }
              else if (stmt_00 == LY_STMT_TYPE) {
                LVar4 = lysp_stmt_type(ctx,stmt_01,(lysp_type *)&plVar5[1].next);
              }
              else {
                substmt_index = iVar2 + 0xb8;
                if (stmt_00 == LY_STMT_UNITS) goto LAB_0016cba5;
                if (stmt_00 != LY_STMT_WHEN) goto LAB_0016cc7d;
                LVar4 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&plVar5[1].nodetype);
              }
LAB_0016cc01:
              if (LVar4 != LY_SUCCESS) break;
            }
            stmt_01 = stmt_01->next;
            bVar9 = stmt_01 == (lysp_stmt *)0x0;
            LVar4 = LVar3;
          } while (!bVar9);
        }
        if ((bVar9) && (LVar4 = LY_SUCCESS, plVar5[1].next == (lysp_node *)0x0)) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Missing mandatory keyword \"%s\" as a child of \"%s\".","type","leaf");
          LVar4 = LY_EVALID;
        }
      }
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
lysp_stmt_leaf(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent, struct lysp_node **siblings)
{
    struct lysp_node_leaf *leaf;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new leaf structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, leaf, next, LY_EMEM);
    leaf->nodetype = LYS_LEAF;
    leaf->parent = parent;

    /* get name */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &leaf->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->dflt.str, Y_STR_ARG, &leaf->exts));
            leaf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->dsc, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &leaf->iffeatures, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &leaf->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->ref, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(lysp_stmt_type(ctx, child, &leaf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->units, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &leaf->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_LEAF, 0, &leaf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "leaf");
            return LY_EVALID;
        }
    }

    /* mandatory substatements */
    if (!leaf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}